

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viff.cxx
# Opt level: O0

void __thiscall vigra::ViffDecoder::~ViffDecoder(ViffDecoder *this)

{
  undefined8 *in_RDI;
  ViffDecoderImpl *this_00;
  
  *in_RDI = &PTR__ViffDecoder_001bf9d0;
  this_00 = (ViffDecoderImpl *)in_RDI[5];
  if (this_00 != (ViffDecoderImpl *)0x0) {
    ViffDecoderImpl::~ViffDecoderImpl(this_00);
    operator_delete(this_00);
  }
  Decoder::~Decoder((Decoder *)0x1a114c);
  return;
}

Assistant:

ViffDecoder::~ViffDecoder()
    {
        delete pimpl;
    }